

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBInterpolater.cpp
# Opt level: O3

void __thiscall
amrex::EBCellConservativeLinear::interp
          (EBCellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,
          Geometry *fine_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int actual_comp,int actual_state,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  EBCellFlagFab *this_00;
  EBCellFlagFab *this_01;
  EBCellFlag *pEVar14;
  double *pdVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 uVar18;
  FabType FVar19;
  FabType FVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  bool bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  Box lhs;
  EBFArrayBox *crse_eb;
  Box local_188;
  ulong local_168;
  double *local_160;
  FArrayBox *local_158;
  int local_150;
  undefined4 uStack_14c;
  Box local_4c;
  
  _local_150 = CONCAT44(uStack_14c,crse_comp);
  CellConservativeLinear::interp
            (&this->super_CellConservativeLinear,crse,crse_comp,fine,fine_comp,ncomp,fine_region,
             ratio,crse_geom,fine_geom,bcr,actual_comp,actual_state,runon);
  uVar36 = *(ulong *)(fine_region->smallend).vect;
  uVar17 = *(ulong *)(fine_region->bigend).vect;
  uVar18 = *(undefined8 *)((fine_region->bigend).vect + 2);
  local_188.smallend.vect[2] = (int)*(undefined8 *)((fine_region->smallend).vect + 2);
  uVar37 = *(ulong *)(fine->super_BaseFab<double>).domain.smallend.vect;
  uVar35 = CONCAT44(-(uint)((int)(uVar37 >> 0x20) < (int)(uVar36 >> 0x20)),
                    -(uint)((int)uVar37 < (int)uVar36));
  local_188.smallend.vect._0_8_ = ~uVar35 & uVar37 | uVar36 & uVar35;
  uVar25 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  if ((int)uVar25 < local_188.smallend.vect[2]) {
    uVar25 = local_188.smallend.vect[2];
  }
  uVar37 = *(ulong *)(fine->super_BaseFab<double>).domain.bigend.vect;
  uVar36 = CONCAT44(-(uint)((int)(uVar17 >> 0x20) < (int)(uVar37 >> 0x20)),
                    -(uint)((int)uVar17 < (int)uVar37));
  uVar37 = ~uVar36 & uVar37 | uVar17 & uVar36;
  local_188.bigend.vect[0] = (int)uVar37;
  local_188.bigend.vect[1] = (int)(uVar37 >> 0x20);
  local_188.bigend.vect[2] = (int)uVar18;
  iVar26 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  if (local_188.bigend.vect[2] < iVar26) {
    iVar26 = local_188.bigend.vect[2];
  }
  local_188.btype.itype = (uint)((ulong)uVar18 >> 0x20);
  local_188.bigend.vect[2] = iVar26;
  if (*(int *)&(crse->super_BaseFab<double>).field_0x44 != 0) {
    this_00 = (EBCellFlagFab *)crse[1].super_BaseFab<double>._vptr_BaseFab;
    this_01 = (EBCellFlagFab *)fine[1].super_BaseFab<double>._vptr_BaseFab;
    local_188.smallend.vect[2] = uVar25;
    local_158 = crse;
    (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
              (&local_4c,this,&local_188,ratio);
    FVar19 = EBCellFlagFab::getType(this_01,&local_188);
    FVar20 = EBCellFlagFab::getType(this_00,&local_4c);
    if ((FVar19 == multivalued) || (FVar20 == multivalued)) {
      Abort_host("EBCellConservativeLinear::interp: multivalued not implemented");
    }
    else if ((FVar19 != covered) && (0 < ncomp)) {
      iVar26 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
      iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
      iVar2 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
      lVar30 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar26) + 1);
      lVar31 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
      lVar33 = lVar31 * lVar30 *
               (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
      pEVar14 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar3 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      local_160 = (fine->super_BaseFab<double>).dptr +
                  ((fine_comp * lVar33 + (long)local_188.smallend.vect[0]) - (long)iVar26);
      iVar26 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      iVar4 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      iVar5 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
      lVar23 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar3) +
                     1);
      pdVar15 = (local_158->super_BaseFab<double>).dptr;
      iVar6 = (local_158->super_BaseFab<double>).domain.smallend.vect[0];
      iVar7 = (local_158->super_BaseFab<double>).domain.smallend.vect[1];
      iVar8 = (local_158->super_BaseFab<double>).domain.smallend.vect[2];
      iVar9 = (local_158->super_BaseFab<double>).domain.bigend.vect[2];
      lVar24 = (long)(((local_158->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
      lVar27 = (((local_158->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1) * lVar24;
      iVar10 = ratio->vect[0];
      iVar11 = ratio->vect[1];
      iVar12 = ratio->vect[2];
      local_168 = 0;
      do {
        if (local_188.smallend.vect[2] <= local_188.bigend.vect[2]) {
          uVar25 = local_188.smallend.vect[2];
          do {
            if (local_188.smallend.vect[1] <= local_188.bigend.vect[1]) {
              uVar16 = local_188.smallend.vect[1];
              do {
                if (local_188.smallend.vect[0] <= local_188.bigend.vect[0]) {
                  pdVar29 = (double *)
                            ((((long)(int)uVar25 - (long)iVar2) * lVar31 * 8 + (long)iVar1 * -8 +
                             (long)(int)uVar16 * 8) * lVar30 + (long)local_160);
                  uVar37 = (long)local_188.smallend.vect[0];
                  uVar22 = ~local_188.smallend.vect[0];
                  do {
                    uVar32 = (uint)uVar37;
                    if (iVar10 == 4) {
                      if ((long)uVar37 < 0) {
                        uVar32 = (int)uVar32 >> 2;
                      }
                      else {
                        uVar32 = uVar32 >> 2;
                      }
                    }
                    else if (iVar10 == 2) {
                      if ((long)uVar37 < 0) {
                        uVar32 = (int)uVar32 >> 1;
                      }
                      else {
                        uVar32 = uVar32 >> 1;
                      }
                    }
                    else if (iVar10 != 1) {
                      if ((long)uVar37 < 0) {
                        uVar32 = ~((int)uVar22 / iVar10);
                      }
                      else {
                        uVar32 = (uint)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 |
                                              uVar37 & 0xffffffff) / (long)iVar10);
                      }
                    }
                    uVar28 = uVar16;
                    if (((iVar11 != 1) && (uVar28 = (int)uVar16 >> 2, iVar11 != 4)) &&
                       (uVar28 = (int)uVar16 >> 1, iVar11 != 2)) {
                      if ((int)uVar16 < 0) {
                        uVar28 = ~((int)~uVar16 / iVar11);
                      }
                      else {
                        uVar28 = (int)uVar16 / iVar11;
                      }
                    }
                    uVar21 = uVar25;
                    if (((iVar12 != 1) && (uVar21 = (int)uVar25 >> 2, iVar12 != 4)) &&
                       (uVar21 = (int)uVar25 >> 1, iVar12 != 2)) {
                      if ((int)uVar25 < 0) {
                        uVar21 = ~((int)~uVar25 / iVar12);
                      }
                      else {
                        uVar21 = (int)uVar25 / iVar12;
                      }
                    }
                    uVar13 = pEVar14[(int)(uVar28 - iVar26) * lVar23 +
                                     (long)(int)(uVar32 - iVar3) +
                                     ((long)(int)uVar21 - (long)iVar4) *
                                     ((iVar5 - iVar26) + 1) * lVar23].flag;
                    if (((uVar13 >> 0xf & 1) - ((int)uVar13 >> 0x1f)) +
                        (uint)((uVar13 >> 0x10 & 1) != 0) + (uVar13 >> 0x11 & 1) +
                        (uint)((uVar13 >> 0x13 & 1) != 0) + (uVar13 >> 0x14 & 1) +
                        (uint)((uVar13 >> 0x15 & 1) != 0) + (uVar13 >> 0x16 & 1) +
                        (uint)((uVar13 >> 5 & 1) != 0) + (uVar13 >> 6 & 1) +
                        (uint)((uVar13 >> 7 & 1) != 0) + (uVar13 >> 8 & 1) +
                        (uint)((uVar13 >> 9 & 1) != 0) + (uVar13 >> 10 & 1) +
                        (uint)((uVar13 >> 0xb & 1) != 0) + (uVar13 >> 0xc & 1) +
                        (uint)((uVar13 >> 0xd & 1) != 0) + (uVar13 >> 0x17 & 1) +
                        (uint)((uVar13 >> 0x18 & 1) != 0) + (uVar13 >> 0x19 & 1) +
                        (uint)((uVar13 >> 0x1a & 1) != 0) + (uVar13 >> 0x1b & 1) +
                        (uint)((uVar13 >> 0x1c & 1) != 0) + (uVar13 >> 0x1d & 1) +
                        (uint)((uVar13 >> 0x1e & 1) != 0) + 1 + (uint)((uVar13 >> 0xe & 1) != 0) <
                        0x1b) {
                      *pdVar29 = pdVar15[(int)(uVar28 - iVar7) * lVar24 +
                                         (long)(int)(uVar32 - iVar6) +
                                         (int)(uVar21 - iVar8) * lVar27 +
                                         ((long)local_150 + local_168) *
                                         ((iVar9 - iVar8) + 1) * lVar27];
                    }
                    uVar37 = uVar37 + 1;
                    pdVar29 = pdVar29 + 1;
                    uVar22 = uVar22 - 1;
                  } while (local_188.bigend.vect[0] + 1 != (int)uVar37);
                }
                bVar34 = uVar16 != local_188.bigend.vect[1];
                uVar16 = uVar16 + 1;
              } while (bVar34);
            }
            bVar34 = uVar25 != local_188.bigend.vect[2];
            uVar25 = uVar25 + 1;
          } while (bVar34);
        }
        local_168 = local_168 + 1;
        local_160 = local_160 + lVar33;
      } while (local_168 != (uint)ncomp);
    }
  }
  return;
}

Assistant:

void
EBCellConservativeLinear::interp (const FArrayBox& crse,
                                  int              crse_comp,
                                  FArrayBox&       fine,
                                  int              fine_comp,
                                  int              ncomp,
                                  const Box&       fine_region,
                                  const IntVect&   ratio,
                                  const Geometry&  crse_geom,
                                  const Geometry&  fine_geom,
                                  Vector<BCRec> const&  bcr,
                                  int              actual_comp,
                                  int              actual_state,
                                  RunOn            runon)
{
    CellConservativeLinear::interp(crse, crse_comp, fine, fine_comp, ncomp, fine_region, ratio,
                                   crse_geom, fine_geom, bcr, actual_comp, actual_state, runon);

    const Box& target_fine_region = fine_region & fine.box();

    if (crse.getType() == FabType::regular)
    {
        BL_ASSERT(amrex::getEBCellFlagFab(fine).getType(target_fine_region) == FabType::regular);
    }
    else
    {
        const EBFArrayBox& crse_eb = static_cast<EBFArrayBox const&>(crse);
        EBFArrayBox&       fine_eb = static_cast<EBFArrayBox      &>(fine);

        const EBCellFlagFab& crse_flag = crse_eb.getEBCellFlagFab();
        const EBCellFlagFab& fine_flag = fine_eb.getEBCellFlagFab();

        const Box& crse_bx = CoarseBox(target_fine_region,ratio);

        const FabType ftype = fine_flag.getType(target_fine_region);
        const FabType ctype = crse_flag.getType(crse_bx);

        if (ftype == FabType::multivalued || ctype == FabType::multivalued)
        {
            amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
        }
        else if (ftype == FabType::covered)
        {
            ; // don't need to do anything special
        }
        else
        {
            const auto& cflag = crse_flag.const_array();
            auto const& fa = fine.array();
            auto const& ca = crse.const_array();
            AMREX_HOST_DEVICE_FOR_4D_FLAG(runon, target_fine_region, ncomp, i, j, k, n,
            {
                Dim3 cxyz = amrex::coarsen(Dim3{i,j,k}, ratio);
                if (cflag(cxyz.x,cxyz.y,cxyz.z).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fa(i,j,k,n+fine_comp) = ca(cxyz.x,cxyz.y,cxyz.z,n+crse_comp);
                }
            });
        }
    }
}